

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::MoveRegToMemByConst::processMemoryTemps
          (MoveRegToMemByConst *this,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared,
          AssemblyCommands *newAssemblyCommands,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *spilledToOffset,CTemp *beginSP)

{
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &thisShared->
              super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>);
  onlyRightProcessMemoryTemps
            (newAssemblyCommands,spilledToOffset,beginSP,
             (shared_ptr<AssemblyCode::AssemblyCommand> *)&_Stack_38,&this->source);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void AssemblyCode::MoveRegToMemByConst::processMemoryTemps( std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                                            AssemblyCommands &newAssemblyCommands,
                                                            std::map<std::string, int> &spilledToOffset,
                                                            IRT::CTemp &beginSP ) {

    onlyRightProcessMemoryTemps(newAssemblyCommands, spilledToOffset, beginSP,
                                thisShared, source);

}